

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall cmMakefile::PlatformIsAppleIos(cmMakefile *this)

{
  char *pcVar1;
  long lVar2;
  bool bVar3;
  string *local_278;
  allocator local_1b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  ulong local_170;
  size_t i;
  string *local_160;
  string local_158 [8];
  string embedded [6];
  string local_90;
  allocator local_59;
  string local_58;
  undefined1 local_38 [8];
  string sdkRoot;
  cmMakefile *this_local;
  
  sdkRoot.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"CMAKE_OSX_SYSROOT",&local_59);
  pcVar1 = GetSafeDefinition(this,&local_58);
  std::__cxx11::string::operator=((string *)local_38,pcVar1);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  cmsys::SystemTools::LowerCase(&local_90,(string *)local_38);
  std::__cxx11::string::operator=((string *)local_38,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  i._1_1_ = 1;
  local_160 = local_158;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"appletvos",(allocator *)((long)&i + 7));
  local_160 = (string *)(embedded[0].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(embedded[0].field_2._M_local_buf + 8),"appletvsimulator",
             (allocator *)((long)&i + 6));
  local_160 = (string *)(embedded[1].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(embedded[1].field_2._M_local_buf + 8),"iphoneos",(allocator *)((long)&i + 5)
            );
  local_160 = (string *)(embedded[2].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(embedded[2].field_2._M_local_buf + 8),"iphonesimulator",
             (allocator *)((long)&i + 4));
  local_160 = (string *)(embedded[3].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(embedded[3].field_2._M_local_buf + 8),"watchos",(allocator *)((long)&i + 3))
  ;
  local_160 = (string *)(embedded[4].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(embedded[4].field_2._M_local_buf + 8),"watchsimulator",
             (allocator *)((long)&i + 2));
  i._1_1_ = 0;
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 2));
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 4));
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 5));
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 7));
  local_170 = 0;
  do {
    if (5 < local_170) {
      this_local._7_1_ = false;
LAB_006acbde:
      local_278 = (string *)(embedded[5].field_2._M_local_buf + 8);
      do {
        local_278 = local_278 + -0x20;
        std::__cxx11::string::~string(local_278);
      } while (local_278 != local_158);
      std::__cxx11::string::~string((string *)local_38);
      return this_local._7_1_;
    }
    lVar2 = std::__cxx11::string::find
                      ((string *)local_38,(ulong)((long)&embedded[local_170 - 1].field_2 + 8));
    bVar3 = true;
    if (lVar2 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1b0,"/",&local_1b1);
      std::operator+(&local_190,&local_1b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&embedded[local_170 - 1].field_2 + 8));
      lVar2 = std::__cxx11::string::find((string *)local_38,(ulong)&local_190);
      bVar3 = lVar2 != -1;
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
    }
    if (bVar3) {
      this_local._7_1_ = true;
      goto LAB_006acbde;
    }
    local_170 = local_170 + 1;
  } while( true );
}

Assistant:

bool cmMakefile::PlatformIsAppleIos() const
{
  std::string sdkRoot;
  sdkRoot = this->GetSafeDefinition("CMAKE_OSX_SYSROOT");
  sdkRoot = cmSystemTools::LowerCase(sdkRoot);

  const std::string embedded[] = {
    "appletvos",       "appletvsimulator", "iphoneos",
    "iphonesimulator", "watchos",          "watchsimulator",
  };

  for (size_t i = 0; i < sizeof(embedded) / sizeof(embedded[0]); ++i) {
    if (sdkRoot.find(embedded[i]) == 0 ||
        sdkRoot.find(std::string("/") + embedded[i]) != std::string::npos) {
      return true;
    }
  }

  return false;
}